

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O0

int32 __thiscall rw::MaterialList::appendMaterial(MaterialList *this,Material *mat)

{
  int iVar1;
  Material **ppMStack_28;
  int32 space;
  Material **ml;
  Material *mat_local;
  MaterialList *this_local;
  
  if (this->space <= this->numMaterials) {
    iVar1 = this->space + 0x14;
    if (this->materials == (Material **)0x0) {
      ppMStack_28 = (Material **)
                    malloc_LOC((long)iVar1 << 3,0x30007,
                               "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 744"
                              );
    }
    else {
      ppMStack_28 = (Material **)
                    realloc_LOC(this->materials,(long)iVar1 << 3,0x30007,
                                "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 742"
                               );
    }
    if (ppMStack_28 == (Material **)0x0) {
      return -1;
    }
    this->space = iVar1;
    this->materials = ppMStack_28;
  }
  iVar1 = this->numMaterials;
  this->numMaterials = iVar1 + 1;
  this->materials[iVar1] = mat;
  Material::addRef(mat);
  return this->numMaterials + -1;
}

Assistant:

int32
MaterialList::appendMaterial(Material *mat)
{
	Material **ml;
	int32 space;
	if(this->numMaterials >= this->space){
		space = this->space + 20;
		if(this->materials)
			ml = rwReallocT(Material*, this->materials, space,
						MEMDUR_EVENT | ID_MATERIAL);
		else
			ml = rwMallocT(Material*, space, MEMDUR_EVENT | ID_MATERIAL);
		if(ml == nil)
			return -1;
		this->space = space;
		this->materials = ml;
	}
	this->materials[this->numMaterials++] = mat;
	mat->addRef();
	return this->numMaterials-1;
}